

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O1

Vector<double,_4> * __thiscall
tcu::faceForward<double,4>
          (Vector<double,_4> *__return_storage_ptr__,tcu *this,Vector<double,_4> *n,
          Vector<double,_4> *i,Vector<double,_4> *ref)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Vector<double,_4> *res_1;
  long lVar4;
  double res;
  
  res_1 = __return_storage_ptr__;
  dVar1 = 0.0;
  lVar4 = 0;
  do {
    dVar1 = dVar1 + i->m_data[lVar4] * n->m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (dVar1 < 0.0) {
    dVar1 = *(double *)this;
    dVar2 = *(double *)(this + 8);
    dVar3 = *(double *)(this + 0x18);
    __return_storage_ptr__->m_data[2] = *(double *)(this + 0x10);
    __return_storage_ptr__->m_data[3] = dVar3;
    __return_storage_ptr__->m_data[0] = dVar1;
    __return_storage_ptr__->m_data[1] = dVar2;
    return res_1;
  }
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  lVar4 = 0;
  do {
    __return_storage_ptr__->m_data[lVar4] = -*(double *)(this + lVar4 * 8);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return res_1;
}

Assistant:

inline Vector<T, Size> faceForward (const Vector<T, Size>& n, const Vector<T, Size>& i, const Vector<T, Size>& ref)
{
	return (dot(ref, i) < T(0)) ? n: -n;
}